

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,StringTree *rest_3,
          ArrayPtr<const_char> *rest_4)

{
  Array<char> *pAVar1;
  size_t pos_00;
  char *pcVar2;
  Branch *pBVar3;
  String *text;
  ArrayPtr<const_char> *first_00;
  ArrayPtr<const_char> *rest_00;
  ArrayPtr<const_char> *rest_1_00;
  StringTree *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  StringTree local_70;
  ArrayPtr<const_char> *local_38;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  String *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  local_38 = rest_1;
  rest_local_1 = rest;
  rest_local = (ArrayPtr<const_char> *)first;
  first_local = (String *)branchIndex;
  branchIndex_local = (size_t)pos;
  pos_local = (char *)this;
  pcVar2 = String::begin(&this->text);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  pBVar3->index = (long)pos - (long)pcVar2;
  text = mv<kj::String>((String *)rest_local);
  StringTree(&local_70,text);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  operator=(&pBVar3->content,&local_70);
  ~StringTree(&local_70);
  pos_00 = branchIndex_local;
  pAVar1 = &first_local->content;
  first_00 = fwd<kj::ArrayPtr<char_const>>(rest_local_1);
  rest_00 = fwd<kj::ArrayPtr<char_const>>(local_38);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::StringTree>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,(char *)pos_00,(size_t)((long)&pAVar1->ptr + 1),first_00,rest_00,rest_1_00,
             rest_2_00,rest_3_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}